

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O0

void __thiscall QGraphicsItem::setZValue(QGraphicsItem *this,qreal z)

{
  QGraphicsItemPrivate *pQVar1;
  QGraphicsScenePrivate *pQVar2;
  long *in_RDI;
  long in_FS_OFFSET;
  double in_XMM0_Qa;
  QGraphicsScenePrivate *pQVar3;
  qreal newZ;
  QVariant newZVariant;
  undefined4 in_stack_ffffffffffffff30;
  undefined1 enabled;
  GraphicsItemFlag in_stack_ffffffffffffff34;
  QGraphicsScenePrivate *in_stack_ffffffffffffff38;
  undefined1 in_stack_ffffffffffffff7b;
  undefined1 in_stack_ffffffffffffff7c;
  undefined1 in_stack_ffffffffffffff7d;
  undefined1 in_stack_ffffffffffffff7e;
  undefined1 in_stack_ffffffffffffff7f;
  QRectF *in_stack_ffffffffffffff80;
  QGraphicsItem *in_stack_ffffffffffffff88;
  QVariant local_68;
  QVariant local_48;
  anon_union_24_3_e3d07ef4_for_data local_28;
  undefined1 *local_10;
  long local_8;
  
  enabled = (undefined1)((uint)in_stack_ffffffffffffff30 >> 0x18);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_28.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
  local_28._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_28._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_10 = &DAT_aaaaaaaaaaaaaaaa;
  ::QVariant::QVariant(&local_48,in_XMM0_Qa);
  (**(code **)(*in_RDI + 0x108))(&local_28,in_RDI,0x17,&local_48);
  ::QVariant::~QVariant(&local_48);
  pQVar3 = (QGraphicsScenePrivate *)::QVariant::toReal((bool *)local_28.data);
  pQVar2 = pQVar3;
  pQVar1 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
           operator->((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                       *)(in_RDI + 1));
  if (((double)pQVar3 != pQVar1->z) || (NAN((double)pQVar3) || NAN(pQVar1->z))) {
    pQVar1 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
             operator->((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                         *)(in_RDI + 1));
    if (pQVar1->scene != (QGraphicsScene *)0x0) {
      QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::operator->
                ((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                  *)(in_RDI + 1));
      pQVar3 = QGraphicsScene::d_func((QGraphicsScene *)0x97fedf);
      if (pQVar3->indexMethod != NoIndex) {
        QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
        operator->((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                    *)(in_RDI + 1));
        pQVar3 = QGraphicsScene::d_func((QGraphicsScene *)0x97ff02);
        (**(code **)(*(long *)pQVar3->index + 200))
                  (pQVar3->index,in_RDI,0x17,&stack0xffffffffffffff90);
      }
    }
    pQVar3 = pQVar2;
    pQVar1 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
             operator->((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                         *)(in_RDI + 1));
    pQVar1->z = (qreal)pQVar2;
    pQVar1 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
             operator->((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                         *)(in_RDI + 1));
    if (pQVar1->parent == (QGraphicsItem *)0x0) {
      pQVar1 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
               operator->((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                           *)(in_RDI + 1));
      if (pQVar1->scene != (QGraphicsScene *)0x0) {
        QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
        operator->((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                    *)(in_RDI + 1));
        pQVar2 = QGraphicsScene::d_func((QGraphicsScene *)0x97ffcc);
        *(uint *)&pQVar2->field_0xb8 = *(uint *)&pQVar2->field_0xb8 & 0xffffffdf | 0x20;
      }
    }
    else {
      pQVar1 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
               operator->((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                           *)(in_RDI + 1));
      pQVar1 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
               operator->(&pQVar1->parent->d_ptr);
      *(ulong *)&pQVar1->field_0x160 =
           *(ulong *)&pQVar1->field_0x160 & 0xffffffffdfffffff | 0x20000000;
    }
    pQVar1 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
             operator->((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                         *)(in_RDI + 1));
    if (pQVar1->scene != (QGraphicsScene *)0x0) {
      QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::operator->
                ((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                  *)(in_RDI + 1));
      in_stack_ffffffffffffff38 = QGraphicsScene::d_func((QGraphicsScene *)0x980012);
      QRectF::QRectF((QRectF *)&stack0xffffffffffffff70);
      enabled = 0;
      QGraphicsScenePrivate::markDirty
                (pQVar3,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
                 (bool)in_stack_ffffffffffffff7f,(bool)in_stack_ffffffffffffff7e,
                 (bool)in_stack_ffffffffffffff7d,(bool)in_stack_ffffffffffffff7c,
                 (bool)in_stack_ffffffffffffff7b);
    }
    (**(code **)(*in_RDI + 0x108))(&local_68,in_RDI,0x18,&local_28);
    ::QVariant::~QVariant(&local_68);
    pQVar1 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
             operator->((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                         *)(in_RDI + 1));
    if ((*(ulong *)&pQVar1->field_0x160 & 0x200000000000) != 0) {
      setFlag((QGraphicsItem *)in_stack_ffffffffffffff38,in_stack_ffffffffffffff34,(bool)enabled);
    }
    pQVar1 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
             operator->((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                         *)(in_RDI + 1));
    if ((*(ulong *)&pQVar1->field_0x160 >> 0x38 & 1) != 0) {
      QGraphicsObject::zChanged((QGraphicsObject *)0x9800f3);
    }
  }
  ::QVariant::~QVariant((QVariant *)&local_28);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QGraphicsItem::setZValue(qreal z)
{
    const QVariant newZVariant(itemChange(ItemZValueChange, z));
    qreal newZ = newZVariant.toReal();
    if (newZ == d_ptr->z)
        return;

    if (d_ptr->scene && d_ptr->scene->d_func()->indexMethod != QGraphicsScene::NoIndex) {
        // Z Value has changed, we have to notify the index.
        d_ptr->scene->d_func()->index->itemChange(this, ItemZValueChange, &newZ);
    }

    d_ptr->z = newZ;
    if (d_ptr->parent)
        d_ptr->parent->d_ptr->needSortChildren = 1;
    else if (d_ptr->scene)
        d_ptr->scene->d_func()->needSortTopLevelItems = 1;

    if (d_ptr->scene)
        d_ptr->scene->d_func()->markDirty(this, QRectF(), /*invalidateChildren=*/true);

    itemChange(ItemZValueHasChanged, newZVariant);

    if (d_ptr->flags & ItemNegativeZStacksBehindParent)
        setFlag(QGraphicsItem::ItemStacksBehindParent, z < qreal(0.0));

    if (d_ptr->isObject)
        emit static_cast<QGraphicsObject *>(this)->zChanged();
}